

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobatto_polynomial.cpp
# Opt level: O0

void lobatto_polynomial_plot(int ndx_num,int *ndx,string *prefix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  undefined8 uVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  void *local_4d8;
  double *yp;
  double *y;
  double x_lo;
  double x_hi;
  double *x;
  string plot_filename;
  int n;
  double *lp;
  double *l;
  int j;
  int i;
  ofstream data_unit;
  string local_270 [8];
  string data_filename;
  ostream local_240 [8];
  ofstream command_unit;
  string local_40 [8];
  string command_filename;
  string *prefix_local;
  int *ndx_local;
  int ndx_num_local;
  
  command_filename.field_2._8_8_ = prefix;
  std::__cxx11::string::string(local_40);
  std::ofstream::ofstream(local_240);
  std::__cxx11::string::string(local_270);
  std::ofstream::ofstream(&j);
  std::__cxx11::string::string((string *)&x);
  y = (double *)0xbff0000000000000;
  x_lo = 1.0;
  x_hi = (double)r8vec_linspace_new(lobatto_polynomial_plot::x_num,-1.0,1.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(lobatto_polynomial_plot::x_num * ndx_num);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  yp = (double *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(lobatto_polynomial_plot::x_num * ndx_num);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_4d8 = operator_new__(uVar3);
  for (l._0_4_ = 0; (int)l < ndx_num; l._0_4_ = (int)l + 1) {
    plot_filename.field_2._12_4_ = ndx[(int)l];
    pdVar4 = lobatto_polynomial_value
                       (lobatto_polynomial_plot::x_num,plot_filename.field_2._12_4_,(double *)x_hi);
    for (l._4_4_ = 0; l._4_4_ < lobatto_polynomial_plot::x_num; l._4_4_ = l._4_4_ + 1) {
      yp[l._4_4_ + (int)l * lobatto_polynomial_plot::x_num] =
           pdVar4[l._4_4_ + (plot_filename.field_2._12_4_ + -1) * lobatto_polynomial_plot::x_num];
    }
    if (pdVar4 != (double *)0x0) {
      operator_delete__(pdVar4);
    }
    pdVar4 = lobatto_polynomial_derivative
                       (lobatto_polynomial_plot::x_num,plot_filename.field_2._12_4_,(double *)x_hi);
    for (l._4_4_ = 0; l._4_4_ < lobatto_polynomial_plot::x_num; l._4_4_ = l._4_4_ + 1) {
      *(double *)((long)local_4d8 + (long)(l._4_4_ + (int)l * lobatto_polynomial_plot::x_num) * 8) =
           pdVar4[l._4_4_ + (plot_filename.field_2._12_4_ + -1) * lobatto_polynomial_plot::x_num];
    }
    if (pdVar4 != (double *)0x0) {
      operator_delete__(pdVar4);
    }
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator+(&local_4f8,prefix,"_value_data.txt");
  std::__cxx11::string::operator=(local_270,(string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(&j,uVar5,0x10);
  for (l._4_4_ = 0; l._4_4_ < lobatto_polynomial_plot::x_num; l._4_4_ = l._4_4_ + 1) {
    std::ostream::operator<<((ostream *)&j,*(double *)((long)x_hi + (long)l._4_4_ * 8));
    for (l._0_4_ = 0; (int)l < ndx_num; l._0_4_ = (int)l + 1) {
      poVar6 = std::operator<<((ostream *)&j,"  ");
      std::ostream::operator<<(poVar6,yp[l._4_4_ + (int)l * lobatto_polynomial_plot::x_num]);
    }
    std::operator<<((ostream *)&j,"\n");
  }
  std::ofstream::close();
  poVar6 = std::operator<<((ostream *)&std::cout,"  Lobatto value data in \'");
  poVar6 = std::operator<<(poVar6,local_270);
  std::operator<<(poVar6,"\'\n");
  std::operator+(&local_518,prefix,"_value_commands.txt");
  std::__cxx11::string::operator=(local_40,(string *)&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(local_240,uVar5,0x10);
  poVar6 = std::operator<<(local_240,"# ");
  poVar6 = std::operator<<(poVar6,local_40);
  std::operator<<(poVar6,"\n");
  std::operator<<(local_240,"#\n");
  std::operator<<(local_240,"# Usage:\n");
  poVar6 = std::operator<<(local_240,"#  gnuplot < ");
  poVar6 = std::operator<<(poVar6,local_40);
  std::operator<<(poVar6,"\n");
  std::operator<<(local_240,"#\n");
  std::operator<<(local_240,"unset key\n");
  std::operator<<(local_240,"set term png\n");
  std::operator<<(local_240,"set timestamp\n");
  std::operator+(&local_538,prefix,"_value.png");
  std::__cxx11::string::operator=((string *)&x,(string *)&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  poVar6 = std::operator<<(local_240,"set output \'");
  poVar6 = std::operator<<(poVar6,(string *)&x);
  std::operator<<(poVar6,"\'\n");
  std::operator<<(local_240,"set xlabel \'x\'\n");
  std::operator<<(local_240,"set ylabel \'L(n,x)\'\n");
  std::operator<<(local_240,"set title \'Lobatto values\'\n");
  std::operator<<(local_240,"set grid\n");
  std::operator<<(local_240,"set style data lines\n");
  for (l._0_4_ = 0; (int)l < ndx_num; l._0_4_ = (int)l + 1) {
    if ((int)l == 0) {
      std::operator<<(local_240,"plot \'");
    }
    else {
      std::operator<<(local_240,"     \'");
    }
    poVar6 = std::operator<<(local_240,local_270);
    poVar6 = std::operator<<(poVar6,"\' using 1:");
    std::ostream::operator<<(poVar6,(int)l + 2);
    if ((int)l < ndx_num + -1) {
      std::operator<<(local_240,", \\");
    }
    std::operator<<(local_240,"\n");
  }
  std::operator<<(local_240,"quit\n");
  std::ofstream::close();
  poVar6 = std::operator<<((ostream *)&std::cout,"  Lobatto value commands in \'");
  poVar6 = std::operator<<(poVar6,local_40);
  std::operator<<(poVar6,"\'\n");
  std::operator+(&local_558,prefix,"_derivative_data.txt");
  std::__cxx11::string::operator=(local_270,(string *)&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(&j,uVar5,0x10);
  for (l._4_4_ = 0; l._4_4_ < lobatto_polynomial_plot::x_num; l._4_4_ = l._4_4_ + 1) {
    std::ostream::operator<<((ostream *)&j,*(double *)((long)x_hi + (long)l._4_4_ * 8));
    for (l._0_4_ = 0; (int)l < ndx_num; l._0_4_ = (int)l + 1) {
      poVar6 = std::operator<<((ostream *)&j,"  ");
      std::ostream::operator<<
                (poVar6,*(double *)
                         ((long)local_4d8 +
                         (long)(l._4_4_ + (int)l * lobatto_polynomial_plot::x_num) * 8));
    }
    std::operator<<((ostream *)&j,"\n");
  }
  std::ofstream::close();
  poVar6 = std::operator<<((ostream *)&std::cout,"  Lobatto derivative data stored in \'");
  poVar6 = std::operator<<(poVar6,local_270);
  std::operator<<(poVar6,"\'\n");
  std::operator+(&local_578,prefix,"_derivative_commands.txt");
  std::__cxx11::string::operator=(local_40,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(local_240,uVar5,0x10);
  poVar6 = std::operator<<(local_240,"# ");
  poVar6 = std::operator<<(poVar6,local_40);
  std::operator<<(poVar6,"\n");
  std::operator<<(local_240,"#\n");
  std::operator<<(local_240,"# Usage:\n");
  poVar6 = std::operator<<(local_240,"#  gnuplot < ");
  poVar6 = std::operator<<(poVar6,local_40);
  std::operator<<(poVar6,"\n");
  std::operator<<(local_240,"#\n");
  std::operator<<(local_240,"unset key\n");
  std::operator<<(local_240,"set term png\n");
  std::operator<<(local_240,"set timestamp\n");
  std::operator+(&local_598,prefix,"_derivative.png");
  std::__cxx11::string::operator=((string *)&x,(string *)&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  poVar6 = std::operator<<(local_240,"set output \'");
  poVar6 = std::operator<<(poVar6,(string *)&x);
  std::operator<<(poVar6,"\'\n");
  std::operator<<(local_240,"set xlabel \'x\'\n");
  std::operator<<(local_240,"set ylabel \'L(n,x)\'\n");
  std::operator<<(local_240,"set title \'Lobatto derivatives\'\n");
  std::operator<<(local_240,"set grid\n");
  std::operator<<(local_240,"set style data lines\n");
  for (l._0_4_ = 0; (int)l < ndx_num; l._0_4_ = (int)l + 1) {
    if ((int)l == 0) {
      std::operator<<(local_240,"plot \'");
    }
    else {
      std::operator<<(local_240,"     \'");
    }
    poVar6 = std::operator<<(local_240,local_270);
    poVar6 = std::operator<<(poVar6,"\' using 1:");
    std::ostream::operator<<(poVar6,(int)l + 2);
    if ((int)l < ndx_num + -1) {
      std::operator<<(local_240,", \\");
    }
    std::operator<<(local_240,"\n");
  }
  std::operator<<(local_240,"quit\n");
  std::ofstream::close();
  poVar6 = std::operator<<((ostream *)&std::cout,"  Lobatto derivative commands in \'");
  poVar6 = std::operator<<(poVar6,local_40);
  std::operator<<(poVar6,"\'\n");
  if (x_hi != 0.0) {
    operator_delete__((void *)x_hi);
  }
  if (yp != (double *)0x0) {
    operator_delete__(yp);
  }
  if (local_4d8 != (void *)0x0) {
    operator_delete__(local_4d8);
  }
  std::__cxx11::string::~string((string *)&x);
  std::ofstream::~ofstream(&j);
  std::__cxx11::string::~string(local_270);
  std::ofstream::~ofstream(local_240);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void lobatto_polynomial_plot ( int ndx_num, int ndx[], std::string prefix )

//****************************************************************************80
//
//  Purpose:
//
//    LOBATTO_POLYNOMIAL_PLOT plots one or more completed Lobatto polynomials.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 November 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int NDX_NUM, the number of polynomials to plot.
//
//    Input, int NDX[NDX_NUM], the orders of 1 or more
//    Legendre polynomials to be plotted together.
//
//    Input, string PREFIX. the filename prefix.
//
{
  std::string command_filename;
  std::ofstream command_unit;
  std::string data_filename;
  std::ofstream data_unit;
  int i;
  int j;
  double *l;
  double *lp;
  int n;
  std::string plot_filename;
  double *x;
  double x_hi;
  double x_lo;
  static int x_num = 501;
  double *y;
  double *yp;

  x_lo = -1.0;
  x_hi = +1.0;
  x = r8vec_linspace_new ( x_num, x_lo, x_hi );
//
//  Collect the data.
//
  y = new double[x_num*ndx_num];
  yp = new double[x_num*ndx_num];

  for ( j = 0; j < ndx_num; j++ )
  {
    n = ndx[j];

    l = lobatto_polynomial_value ( x_num, n, x );
    for ( i = 0; i < x_num; i++ )
    {
      y[i+j*x_num] = l[i+(n-1)*x_num];
    }
    delete [] l;

    lp = lobatto_polynomial_derivative ( x_num, n, x );
    for ( i = 0; i < x_num; i++ )
    {
      yp[i+j*x_num] = lp[i+(n-1)*x_num];
    }
    delete [] lp;
  }

  std::cout << "\n";
//
//  Make data file for values.
//
  data_filename = prefix + "_value_data.txt";

  data_unit.open ( data_filename.c_str ( ) );

  for ( i = 0; i < x_num; i++ )
  {
    data_unit << x[i];
    for ( j = 0; j < ndx_num; j++ )
    {
      data_unit << "  " << y[i+j*x_num];
    }
    data_unit << "\n";
  }
  data_unit.close ( );

  std::cout << "  Lobatto value data in '" << data_filename << "'\n";
//
//  Make command file for values.
//
  command_filename = prefix + "_value_commands.txt";

  command_unit.open ( command_filename.c_str ( ) );

  command_unit << "# " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "# Usage:\n";
  command_unit << "#  gnuplot < " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "unset key\n";
  command_unit << "set term png\n";
  command_unit << "set timestamp\n";

  plot_filename = prefix + "_value.png";

  command_unit << "set output '" << plot_filename << "'\n";
  command_unit << "set xlabel 'x'\n";
  command_unit << "set ylabel 'L(n,x)'\n";
  command_unit << "set title 'Lobatto values'\n";
  command_unit << "set grid\n";
  command_unit << "set style data lines\n";
  for ( j = 0; j < ndx_num; j++ )
  {
    if ( j == 0 )
    {
      command_unit << "plot '";
    }
    else
    {
      command_unit << "     '";
    }
    command_unit << data_filename << "' using 1:" << j + 2;
    if ( j < ndx_num - 1 )
    {
      command_unit << ", \\";
    }
    command_unit << "\n";
  }
  command_unit << "quit\n";

  command_unit.close ( );

  std::cout << "  Lobatto value commands in '" << command_filename << "'\n";
//
//  Make data file for derivatives.
//
  data_filename = prefix + "_derivative_data.txt";

  data_unit.open ( data_filename.c_str ( ) );

  for ( i = 0; i < x_num; i++ )
  {
    data_unit << x[i];
    for ( j = 0; j < ndx_num; j++ )
    {
      data_unit << "  " << yp[i+j*x_num];
    }
    data_unit << "\n";
  }
  data_unit.close ( );

   std::cout << "  Lobatto derivative data stored in '" << data_filename << "'\n";
//
//  Make command file for derivatives.
//
  command_filename = prefix + "_derivative_commands.txt";

  command_unit.open ( command_filename.c_str ( ) );

  command_unit << "# " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "# Usage:\n";
  command_unit << "#  gnuplot < " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "unset key\n";
  command_unit << "set term png\n";
  command_unit << "set timestamp\n";

  plot_filename = prefix + "_derivative.png";

  command_unit << "set output '" << plot_filename << "'\n";
  command_unit << "set xlabel 'x'\n";
  command_unit << "set ylabel 'L(n,x)'\n";
  command_unit << "set title 'Lobatto derivatives'\n";
  command_unit << "set grid\n";
  command_unit << "set style data lines\n";
  for ( j = 0; j < ndx_num; j++ )
  {
    if ( j == 0 )
    {
      command_unit << "plot '";
    }
    else
    {
      command_unit << "     '";
    }
    command_unit << data_filename << "' using 1:" << j + 2;
    if ( j < ndx_num - 1 )
    {
      command_unit << ", \\";
    }
    command_unit << "\n";
  }
  command_unit << "quit\n";

  command_unit.close ( );

  std::cout << "  Lobatto derivative commands in '" << command_filename << "'\n";

  delete [] x;
  delete [] y;
  delete [] yp;

  return;
}